

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O0

RealType __thiscall OpenMD::Thermo::getPressure(Thermo *this,Snapshot *snap)

{
  double *pdVar1;
  Snapshot *in_RSI;
  double dVar2;
  RealType RVar3;
  RealType pressure;
  Mat3x3d tensor;
  Snapshot *in_stack_00000260;
  Thermo *in_stack_00000268;
  SquareMatrix3<double> *in_stack_ffffffffffffff18;
  SquareMatrix3<double> *in_stack_ffffffffffffff20;
  RectMatrix<double,_3U,_3U> local_58;
  Snapshot *local_10;
  
  local_10 = in_RSI;
  if ((in_RSI->hasPressure & 1U) == 0) {
    SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x170e76);
    getPressureTensor(in_stack_00000268,in_stack_00000260);
    SquareMatrix3<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x170ead);
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,0,0);
    dVar2 = *pdVar1;
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,1,1);
    dVar2 = dVar2 + *pdVar1;
    pdVar1 = RectMatrix<double,_3U,_3U>::operator()(&local_58,2,2);
    Snapshot::setPressure(local_10,((dVar2 + *pdVar1) * 163882576.0) / 3.0);
    SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x170f7a);
  }
  RVar3 = Snapshot::getPressure(local_10);
  return RVar3;
}

Assistant:

RealType Thermo::getPressure(Snapshot* snap) {
    if (!snap->hasPressure) {
      // Relies on the calculation of the full molecular pressure tensor
      Mat3x3d tensor;
      RealType pressure;

      tensor = getPressureTensor(snap);

      pressure = Constants::pressureConvert *
                 (tensor(0, 0) + tensor(1, 1) + tensor(2, 2)) / 3.0;

      snap->setPressure(pressure);
    }

    return snap->getPressure();
  }